

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O0

void rand_pos(int n)

{
  int iVar1;
  int aiStack_28 [2];
  int quad [4];
  int local_10;
  int k;
  int i;
  int n_local;
  
  for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
    aiStack_28[local_10] = 0;
  }
  for (local_10 = 0; local_10 < n; local_10 = local_10 + 1) {
    iVar1 = rand();
    quad[3] = iVar1 % 4;
    if (aiStack_28[quad[3]] == 0) {
      aiStack_28[quad[3]] = 1;
    }
    else {
      while (aiStack_28[quad[3]] != 0) {
        quad[3] = quad[3] + 1;
        if (quad[3] == 4) {
          quad[3] = 0;
        }
      }
      aiStack_28[quad[3]] = 1;
    }
    iVar1 = rand();
    iVar1 = iVar1 % 5000 + (quad[3] % 2) * 5000;
    robots[local_10].x = iVar1;
    robots[local_10].org_x = iVar1;
    iVar1 = rand();
    iVar1 = iVar1 % 5000 + (uint)(quad[3] < 2) * 5000;
    robots[local_10].y = iVar1;
    robots[local_10].org_y = iVar1;
  }
  return;
}

Assistant:

void rand_pos(int n)
{
	int i, k;
	int quad[4];

	for (i = 0; i < 4; i++) {
		quad[i] = 0;
	}

	/* get a new quadrant */
	for (i = 0; i < n; i++) {
		k = rand() % 4;
		if (quad[k] == 0)
			quad[k] = 1;
		else {
			while (quad[k] != 0) {
				if (++k == 4)
					k = 0;
			}
			quad[k] = 1;
		}
		robots[i].org_x = robots[i].x =
			(rand() % (MAX_X * CLICK / 2)) + ((MAX_X * CLICK / 2) * (k % 2));
		robots[i].org_y = robots[i].y =
			(rand() % (MAX_Y * CLICK / 2)) + ((MAX_Y * CLICK / 2) * (k<2));
	}
}